

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  Headers *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  Response *pRVar5;
  Request *req_00;
  undefined8 uVar6;
  undefined8 uVar7;
  HandlerResponse HVar8;
  int iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Alloc_hider _Var11;
  ostream *poVar12;
  const_iterator cVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ssize_t sVar15;
  _Base_ptr p_Var16;
  long lVar17;
  int extraout_var;
  int extraout_var_00;
  char *pcVar18;
  long lVar19;
  size_t offset;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar23;
  string boundary;
  string content_type;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Response *local_288;
  Server *local_280;
  _Base_ptr local_278;
  undefined **local_270;
  Request *local_268;
  Stream *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218;
  key_type local_1f8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined8 local_1b0;
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  local_260 = strm;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                  ,0x155d,
                  "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
                 );
  }
  local_280 = this;
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HVar8 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    need_apply_ranges = HVar8 == Handled || need_apply_ranges;
  }
  paVar1 = &local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = (pointer)paVar1;
  if (need_apply_ranges != false) {
    apply_ranges(local_280,req,res,&local_218,&local_238);
  }
  bVar22 = true;
  if (!close_connection) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Connection","");
    pVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&(req->headers)._M_t,&local_1f8);
    if (pVar23.first._M_node._M_node == pVar23.second._M_node._M_node) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)(pVar23.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_50,pcVar18,(allocator *)local_1d8);
    iVar9 = std::__cxx11::string::compare((char *)local_50);
    bVar22 = iVar9 == 0;
  }
  if (!close_connection) {
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  local_288 = res;
  if (bVar22) {
    local_1d8._0_8_ =
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Connection","");
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"close","");
    cVar2 = *(char *)local_1d8._0_8_;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_;
    while (((cVar2 != '\0' &&
            (paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar10->_M_local_buf + 1), cVar2 != '\n')) && (cVar2 != '\r'))) {
      cVar2 = paVar10->_M_local_buf[0];
    }
    if (cVar2 == '\0') {
      cVar2 = *local_2a8._M_dataplus._M_p;
      _Var11._M_p = local_2a8._M_dataplus._M_p;
      while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')))
      {
        cVar2 = *_Var11._M_p;
      }
      if (cVar2 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_288->headers,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   &local_2a8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    res = local_288;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ !=
        &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->field_2)
    {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->
                field_2,"timeout=",8);
    poVar12 = std::ostream::_M_insert<long>
                        ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1d8)->field_2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", max=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Keep-Alive","");
    std::__cxx11::stringbuf::str();
    cVar2 = *local_2a8._M_dataplus._M_p;
    _Var11._M_p = local_2a8._M_dataplus._M_p;
    while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r'))) {
      cVar2 = *_Var11._M_p;
    }
    if (cVar2 == '\0') {
      cVar2 = *local_258._M_dataplus._M_p;
      _Var11._M_p = local_258._M_dataplus._M_p;
      while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')))
      {
        cVar2 = *_Var11._M_p;
      }
      if (cVar2 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,&local_2a8,&local_258);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
    std::ios_base::~ios_base(local_158);
  }
  paVar10 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->
             field_2;
  local_268 = req;
  local_1d8._0_8_ = paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Type","");
  this_00 = &res->headers;
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1d8);
  local_278 = &(res->headers)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (cVar13._M_node == local_278) {
    if (res->content_length_ != 0 || (res->body)._M_string_length != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != paVar10) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
LAB_0014dd57:
      local_1d8._0_8_ = paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Type","");
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"text/plain","");
      cVar2 = *(char *)local_1d8._0_8_;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_;
      while (((cVar2 != '\0' &&
              (paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(paVar14->_M_local_buf + 1), cVar2 != '\n')) && (cVar2 != '\r'))) {
        cVar2 = paVar14->_M_local_buf[0];
      }
      if (cVar2 == '\0') {
        cVar2 = *local_2a8._M_dataplus._M_p;
        _Var11._M_p = local_2a8._M_dataplus._M_p;
        while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')
               )) {
          cVar2 = *_Var11._M_p;
        }
        if (cVar2 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_2a8);
        }
      }
      res = local_288;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        res = local_288;
      }
      goto joined_r0x0014de2d;
    }
    p_Var3 = (res->content_provider_).super__Function_base._M_manager;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != paVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (p_Var3 != (_Manager_type)0x0) goto LAB_0014dd57;
  }
  else {
joined_r0x0014de2d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != paVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  local_1d8._0_8_ = paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Length","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1d8);
  if ((cVar13._M_node == local_278) &&
     (res->content_length_ == 0 && (res->body)._M_string_length == 0)) {
    p_Var3 = (res->content_provider_).super__Function_base._M_manager;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != paVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (p_Var3 == (_Manager_type)0x0) {
      local_1d8._0_8_ = paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Length","");
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"0","");
      cVar2 = *(char *)local_1d8._0_8_;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_;
      while (((cVar2 != '\0' &&
              (paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(paVar14->_M_local_buf + 1), cVar2 != '\n')) && (cVar2 != '\r'))) {
        cVar2 = paVar14->_M_local_buf[0];
      }
      if (cVar2 == '\0') {
        cVar2 = *local_2a8._M_dataplus._M_p;
        _Var11._M_p = local_2a8._M_dataplus._M_p;
        while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')
               )) {
          cVar2 = *_Var11._M_p;
        }
        if (cVar2 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_2a8);
        }
      }
      res = local_288;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        res = local_288;
      }
      goto joined_r0x0014df9e;
    }
  }
  else {
joined_r0x0014df9e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != paVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  local_1d8._0_8_ = paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Accept-Ranges","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1d8);
  if (cVar13._M_node == local_278) {
    iVar9 = std::__cxx11::string::compare((char *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != paVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (iVar9 == 0) {
      local_1d8._0_8_ = paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Accept-Ranges","");
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"bytes","");
      cVar2 = *(char *)local_1d8._0_8_;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_;
      while (((cVar2 != '\0' &&
              (paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(paVar14->_M_local_buf + 1), cVar2 != '\n')) && (cVar2 != '\r'))) {
        cVar2 = paVar14->_M_local_buf[0];
      }
      if (cVar2 == '\0') {
        cVar2 = *local_2a8._M_dataplus._M_p;
        _Var11._M_p = local_2a8._M_dataplus._M_p;
        while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')
               )) {
          cVar2 = *_Var11._M_p;
        }
        if (cVar2 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_2a8);
        }
      }
      res = local_288;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        res = local_288;
      }
      goto joined_r0x0014e366;
    }
  }
  else {
joined_r0x0014e366:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != paVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  if ((local_280->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_280->post_routing_handler_)._M_invoker)
              ((_Any_data *)&local_280->post_routing_handler_,local_268,res);
  }
  local_1d8._8_8_ =
       (long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->
             field_2)._M_local_buf + 8;
  local_270 = &PTR__BufferStream_00187540;
  local_1d8._0_8_ = &PTR__BufferStream_00187540;
  local_1c8._M_allocated_capacity = 0;
  local_1c8._M_local_buf[8] = '\0';
  local_1b0 = 0;
  local_2a8._M_dataplus._M_p = detail::status_message(res->status);
  sVar15 = Stream::write_format<int,char_const*>
                     ((Stream *)local_1d8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_2a8);
  if (sVar15 != 0) {
    p_Var16 = (res->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar22 = p_Var16 == local_278;
    if (bVar22) {
      lVar19 = 0;
      paVar10 = paVar1;
    }
    else {
      lVar19 = 0;
      do {
        local_2a8._M_dataplus._M_p = *(pointer *)(p_Var16 + 1);
        local_258._M_dataplus._M_p = *(pointer *)(p_Var16 + 2);
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)Stream::write_format<char_const*,char_const*>
                               ((Stream *)local_1d8,"%s: %s\r\n",(char **)&local_2a8,
                                (char **)&local_258);
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        if (-1 < (long)paVar10) {
          paVar14 = paVar10;
        }
        lVar19 = lVar19 + (long)paVar14;
        if ((long)paVar10 < 0) break;
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        bVar22 = p_Var16 == local_278;
        paVar10 = paVar1;
      } while (!bVar22);
    }
    req_00 = local_268;
    if (bVar22) {
      lVar17 = (**(code **)(local_1d8._0_8_ + 0x28))
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1d8,"\r\n",2);
      if (lVar17 < 0) {
        lVar19 = 0;
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(lVar19 + lVar17);
    }
    uVar7 = local_1c8._M_allocated_capacity;
    uVar6 = local_1d8._8_8_;
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar20 = 0;
      do {
        if ((ulong)uVar7 <= uVar20) break;
        iVar9 = (*local_260->_vptr_Stream[5])(local_260,(undefined1 *)(uVar6 + uVar20));
        lVar19 = 0;
        if (-1 < extraout_var) {
          lVar19 = CONCAT44(extraout_var,iVar9);
        }
        uVar20 = uVar20 + lVar19;
      } while (-1 < extraout_var);
      local_1d8._0_8_ = local_270;
      if ((undefined1 *)local_1d8._8_8_ !=
          (undefined1 *)
          ((long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->
                 field_2)._M_local_buf + 8U)) {
        operator_delete((void *)local_1d8._8_8_,
                        CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1);
      }
      iVar9 = std::__cxx11::string::compare((char *)req_00);
      pRVar5 = local_288;
      bVar22 = true;
      if (iVar9 != 0) {
        uVar20 = (local_288->body)._M_string_length;
        if (uVar20 == 0) {
          if ((local_288->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            bVar22 = write_content_with_provider
                               (local_280,local_260,req_00,local_288,&local_238,&local_218);
            pRVar5->content_provider_success_ = bVar22;
          }
        }
        else {
          pcVar4 = (local_288->body)._M_dataplus._M_p;
          uVar21 = 0;
          do {
            bVar22 = uVar20 <= uVar21;
            if (uVar20 <= uVar21) break;
            iVar9 = (*local_260->_vptr_Stream[5])(local_260,pcVar4 + uVar21);
            lVar19 = 0;
            if (-1 < extraout_var_00) {
              lVar19 = CONCAT44(extraout_var_00,iVar9);
            }
            uVar21 = uVar21 + lVar19;
          } while (-1 < extraout_var_00);
        }
      }
      if ((local_280->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(local_280->logger_)._M_invoker)((_Any_data *)&local_280->logger_,req_00,local_288);
      }
      goto LAB_0014e3ce;
    }
  }
  local_1d8._0_8_ = local_270;
  if ((undefined1 *)local_1d8._8_8_ !=
      (undefined1 *)
      ((long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)->
             field_2)._M_local_buf + 8U)) {
    operator_delete((void *)local_1d8._8_8_,CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1)
    ;
  }
  bVar22 = false;
LAB_0014e3ce:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  return bVar22;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            detail::status_message(res.status))) {
      return false;
    }

    if (!detail::write_headers(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}